

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ArenaStringPtr::Set<>(ArenaStringPtr *this,string *value,Arena *arena)

{
  anon_unknown_8 *this_00;
  bool bVar1;
  string *psVar2;
  char *in_RCX;
  string_view s;
  string_view value_00;
  undefined1 auVar3 [16];
  void *local_30;
  ScopedCheckPtrInvariants local_21;
  anon_unknown_8 *paStack_20;
  ScopedCheckPtrInvariants check;
  Arena *arena_local;
  string *value_local;
  ArenaStringPtr *this_local;
  
  paStack_20 = (anon_unknown_8 *)arena;
  anon_unknown_8::ScopedCheckPtrInvariants::ScopedCheckPtrInvariants(&local_21,&this->tagged_ptr_);
  bVar1 = IsDefault(this);
  this_00 = paStack_20;
  if (bVar1) {
    if (paStack_20 == (anon_unknown_8 *)0x0) {
      auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)value);
      value_00._M_str = auVar3._8_8_;
      value_00._M_len = (size_t)value_00._M_str;
      local_30 = (void *)anon_unknown_8::CreateString(auVar3._0_8_,value_00);
    }
    else {
      auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)value);
      s._M_len = auVar3._8_8_;
      s._M_str = in_RCX;
      local_30 = (void *)anon_unknown_8::CreateArenaString(this_00,auVar3._0_8_,s);
    }
    (this->tagged_ptr_).ptr_ = local_30;
  }
  else {
    psVar2 = UnsafeMutablePointer_abi_cxx11_(this);
    std::__cxx11::string::assign((string *)psVar2);
  }
  return;
}

Assistant:

void ArenaStringPtr::Set(const std::string& value, Arena* arena) {
  ScopedCheckPtrInvariants check(&tagged_ptr_);
  if (IsDefault()) {
    // If we're not on an arena, skip straight to a true string to avoid
    // possible copy cost later.
    tagged_ptr_ = arena != nullptr ? CreateArenaString(*arena, value)
                                   : CreateString(value);
  } else {
    if (internal::DebugHardenForceCopyDefaultString()) {
      if (arena == nullptr) {
        auto* old = tagged_ptr_.GetIfAllocated();
        tagged_ptr_ = CreateString(value);
        delete old;
      } else {
        auto* old = UnsafeMutablePointer();
        tagged_ptr_ = CreateArenaString(*arena, value);
        old->assign("garbagedata");
      }
    } else {
      UnsafeMutablePointer()->assign(value);
    }
  }
}